

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O1

exr_result_t dispatch_print_error(exr_const_context_t_conflict ctxt,exr_result_t code,char *msg,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list fmtargs;
  va_list stkargs;
  char stackbuf [256];
  undefined8 local_218;
  void **local_210;
  undefined1 *local_208;
  undefined8 local_1f8;
  void **local_1f0;
  undefined1 *local_1e8;
  char local_1d8 [256];
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_208 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_210 = &fmtargs[0].overflow_arg_area;
  local_218 = 0x3000000018;
  local_1f8 = 0x3000000018;
  local_1f0 = local_210;
  local_1e8 = local_208;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  iVar1 = vsnprintf(local_1d8,0x100,msg,&local_1f8);
  if (iVar1 < 0x100) {
    pcVar2 = local_1d8;
  }
  else {
    pcVar2 = (char *)(*ctxt->alloc_fn)((ulong)(iVar1 + 1));
    if (pcVar2 != (char *)0x0) {
      vsnprintf(pcVar2,(ulong)(iVar1 + 1),msg,&local_218);
      if (ctxt == (exr_const_context_t_conflict)0x0) {
        default_error_handler((exr_const_context_t_conflict)0x0,code,pcVar2);
      }
      else {
        (*ctxt->error_handler_fn)(ctxt,code,pcVar2);
      }
      (*ctxt->free_fn)(pcVar2);
      return code;
    }
    pcVar2 = "Unable to allocate temporary memory";
  }
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    default_error_handler((exr_const_context_t_conflict)0x0,code,pcVar2);
  }
  else {
    (*ctxt->error_handler_fn)(ctxt,code,pcVar2);
  }
  return code;
}

Assistant:

static exr_result_t
dispatch_print_error (
    exr_const_context_t ctxt, exr_result_t code, const char* msg, ...)
{
    char    stackbuf[256];
    char*   heapbuf = NULL;
    int     nwrit   = 0;
    va_list fmtargs;

    va_start (fmtargs, msg);
    {
        va_list stkargs;

        va_copy (stkargs, fmtargs);
        nwrit = vsnprintf (stackbuf, 256, msg, stkargs);
        va_end (stkargs);
        if (nwrit >= 256)
        {
            heapbuf = ctxt->alloc_fn ((size_t) (nwrit + 1));
            if (heapbuf)
            {
                (void) vsnprintf (heapbuf, (size_t) (nwrit + 1), msg, fmtargs);
                dispatch_error (ctxt, code, heapbuf);
                ctxt->free_fn (heapbuf);
            }
            else
                dispatch_error (
                    ctxt, code, "Unable to allocate temporary memory");
        }
        else
            dispatch_error (ctxt, code, stackbuf);
    }
    va_end (fmtargs);
    return code;
}